

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynBase * ParseAssignment(ParseContext *ctx)

{
  uint uVar1;
  Lexeme *begin;
  Lexeme *pLVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  SynBase *pSVar6;
  SynBase *this;
  undefined4 extraout_var;
  SynBase *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 uVar7;
  undefined4 extraout_var_00;
  
  pSVar6 = ParseTernaryExpr(ctx);
  if (pSVar6 == (SynBase *)0x0) {
    return (SynBase *)0x0;
  }
  begin = ctx->currentLexeme;
  if (begin->type == lex_set) {
    ctx->currentLexeme = begin + 1;
    this = ParseAssignment(ctx);
    if (this == (SynBase *)0x0) {
      anon_unknown.dwarf_16d1cf::Report
                (ctx,ctx->currentLexeme,"ERROR: expression not found after \'=\'");
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])();
      this = (SynBase *)CONCAT44(extraout_var,iVar5);
      SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
      this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
    }
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this_00 = (SynBase *)CONCAT44(extraout_var_00,iVar5);
    if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002201ad;
    SynBase::SynBase(this_00,0x31,begin,ctx->currentLexeme + -1);
    this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f7b60;
    goto LAB_00220189;
  }
  pLVar2 = ctx->currentLexeme;
  uVar7 = 0;
  switch(pLVar2->type) {
  case lex_addset:
    uVar7 = 1;
    break;
  case lex_subset:
    uVar7 = 2;
    break;
  case lex_mulset:
    uVar7 = 3;
    break;
  case lex_divset:
    uVar7 = 4;
    break;
  case lex_powset:
    uVar7 = 5;
    break;
  case lex_modset:
    uVar7 = 6;
    break;
  case lex_shlset:
    uVar7 = 7;
    break;
  case lex_shrset:
    uVar7 = 8;
    break;
  case lex_andset:
    uVar7 = 9;
    break;
  case lex_orset:
    uVar7 = 10;
    break;
  case lex_xorset:
    uVar7 = 0xb;
    break;
  default:
    bVar4 = true;
    goto LAB_002200ba;
  }
  bVar4 = false;
LAB_002200ba:
  if (bVar4) {
    return pSVar6;
  }
  pcVar3 = pLVar2->pos;
  uVar1 = pLVar2->length;
  if (pLVar2->type != lex_none) {
    ctx->currentLexeme = pLVar2 + 1;
  }
  this = ParseAssignment(ctx);
  if (this == (SynBase *)0x0) {
    anon_unknown.dwarf_16d1cf::Report
              (ctx,ctx->currentLexeme,"ERROR: expression not found after \'%.*s\' operator",
               (ulong)uVar1,pcVar3);
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])();
    this = (SynBase *)CONCAT44(extraout_var_01,iVar5);
    SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
    this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
  }
  iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  this_00 = (SynBase *)CONCAT44(extraout_var_02,iVar5);
  if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_002201ad:
    __assert_fail("currentLexeme > firstLexeme",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                  ,0x19c,"Lexeme *ParseContext::Previous()");
  }
  SynBase::SynBase(this_00,0x32,begin,ctx->currentLexeme + -1);
  this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f7b98;
  *(undefined4 *)&this_00->field_0x3c = uVar7;
LAB_00220189:
  this_00[1]._vptr_SynBase = (_func_int **)pSVar6;
  *(SynBase **)&this_00[1].typeID = this;
  return this_00;
}

Assistant:

SynBase* ParseAssignment(ParseContext &ctx)
{
	if(SynBase *lhs = ParseTernaryExpr(ctx))
	{
		Lexeme *pos = ctx.currentLexeme;

		if(ctx.Consume(lex_set))
		{
			SynBase *rhs = ParseAssignment(ctx);

			if(!rhs)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

				rhs = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			return new (ctx.get<SynAssignment>()) SynAssignment(pos, ctx.Previous(), lhs, rhs);
		}
		else if(SynModifyAssignType modifyType = GetModifyAssignType(ctx.Peek()))
		{
			InplaceStr name = ctx.Consume();

			SynBase *rhs = ParseAssignment(ctx);

			if(!rhs)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '%.*s' operator", name.length(), name.begin);

				rhs = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			return new (ctx.get<SynModifyAssignment>()) SynModifyAssignment(pos, ctx.Previous(), modifyType, lhs, rhs);
		}

		return lhs;
	}

	return NULL;
}